

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmanager_args.cpp
# Opt level: O1

Result<void> *
node::ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *args,Options *opts)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  optional<bool> oVar6;
  int64_t iVar7;
  uint64_t uVar8;
  long in_FS_OFFSET;
  char *local_100;
  bilingual_str local_f8;
  bilingual_str local_b8;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar2 = &local_f8.original.field_2;
  local_f8.original._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-blocksxor","");
  oVar6 = ArgsManager::GetBoolArg(args,&local_f8.original);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.original._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.original._M_dataplus._M_p,
                    local_f8.original.field_2._M_allocated_capacity + 1);
  }
  if (((ushort)oVar6.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    opts->use_xor =
         oVar6.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_f8.original._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-prune","");
  iVar7 = ArgsManager::GetIntArg(args,&local_f8.original,opts->prune_target);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.original._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.original._M_dataplus._M_p,
                    local_f8.original.field_2._M_allocated_capacity + 1);
  }
  if (iVar7 < 0) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Prune cannot be configured with a negative value.","");
    paVar2 = &local_58.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Prune cannot be configured with a negative value.","");
    }
    else {
      local_f8.original._M_dataplus._M_p = "Prune cannot be configured with a negative value.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_f8);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    if (local_78 == &local_68) {
      *puVar1 = CONCAT71(uStack_67,local_68);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x18) = uStack_60;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = local_78;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10) =
           CONCAT71(uStack_67,local_68);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8) = local_70;
    local_70 = 0;
    local_68 = 0;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                         local_58.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x38) =
           local_58.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) =
           local_58._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30) =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x28) =
         local_58._M_string_length;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\0';
    local_78 = &local_68;
    local_58._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    if ((iVar7 == 1) || (uVar8 = iVar7 * 0x100000, 0x225ffffe < uVar8 - 1)) {
      opts->prune_target = uVar8;
      local_f8.original._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-fastprune","");
      oVar6 = ArgsManager::GetBoolArg(args,&local_f8.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.original._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8.original._M_dataplus._M_p,
                        local_f8.original.field_2._M_allocated_capacity + 1);
      }
      if (((ushort)oVar6.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> >> 8 & 1) != 0) {
        opts->fast_prune =
             oVar6.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_payload;
      }
      (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\x01';
    }
    else {
      local_f8.original._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,
                 "Prune configured below the minimum of %d MiB.  Please use a higher number.","");
      paVar3 = &local_f8.translated.field_2;
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_f8.translated._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8.translated,
                   "Prune configured below the minimum of %d MiB.  Please use a higher number.","");
      }
      else {
        local_100 = "Prune configured below the minimum of %d MiB.  Please use a higher number.";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_f8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_100);
      }
      local_100 = (char *)0x226;
      tinyformat::format<unsigned_long>(&local_b8,&local_f8,(unsigned_long *)&local_100);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
      paVar4 = &local_b8.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.original._M_dataplus._M_p == paVar4) {
        *puVar1 = CONCAT71(local_b8.original.field_2._M_allocated_capacity._1_7_,
                           local_b8.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x18) =
             local_b8.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_b8.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x10) =
             CONCAT71(local_b8.original.field_2._M_allocated_capacity._1_7_,
                      local_b8.original.field_2._M_local_buf[0]);
      }
      paVar5 = &local_b8.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 8) =
           local_b8.original._M_string_length;
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) = puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.translated._M_dataplus._M_p == paVar5) {
        *puVar1 = CONCAT71(local_b8.translated.field_2._M_allocated_capacity._1_7_,
                           local_b8.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x38) =
             local_b8.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x20) =
             local_b8.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x30) =
             CONCAT71(local_b8.translated.field_2._M_allocated_capacity._1_7_,
                      local_b8.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u + 0x28) =
           local_b8.translated._M_string_length;
      (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\0';
      local_b8.translated.field_2._M_local_buf[0] = '\0';
      local_b8.translated._M_string_length = 0;
      local_b8.original.field_2._M_local_buf[0] = '\0';
      local_b8.original._M_string_length = 0;
      local_b8.original._M_dataplus._M_p = (pointer)paVar4;
      local_b8.translated._M_dataplus._M_p = (pointer)paVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.translated._M_dataplus._M_p != paVar3) {
        operator_delete(local_f8.translated._M_dataplus._M_p,
                        local_f8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8.original._M_dataplus._M_p != paVar2) {
        operator_delete(local_f8.original._M_dataplus._M_p,
                        local_f8.original.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, BlockManager::Options& opts)
{
    if (auto value{args.GetBoolArg("-blocksxor")}) opts.use_xor = *value;
    // block pruning; get the amount of disk space (in MiB) to allot for block & undo files
    int64_t nPruneArg{args.GetIntArg("-prune", opts.prune_target)};
    if (nPruneArg < 0) {
        return util::Error{_("Prune cannot be configured with a negative value.")};
    }
    uint64_t nPruneTarget{uint64_t(nPruneArg) * 1024 * 1024};
    if (nPruneArg == 1) { // manual pruning: -prune=1
        nPruneTarget = BlockManager::PRUNE_TARGET_MANUAL;
    } else if (nPruneTarget) {
        if (nPruneTarget < MIN_DISK_SPACE_FOR_BLOCK_FILES) {
            return util::Error{strprintf(_("Prune configured below the minimum of %d MiB.  Please use a higher number."), MIN_DISK_SPACE_FOR_BLOCK_FILES / 1024 / 1024)};
        }
    }
    opts.prune_target = nPruneTarget;

    if (auto value{args.GetBoolArg("-fastprune")}) opts.fast_prune = *value;

    return {};
}